

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::PortalImageInfiniteLight::ImageLookup
          (PortalImageInfiniteLight *this,Point2f *st,SampledWavelengths *lambda)

{
  Tuple2<pbrt::Point2,_float> TVar1;
  RGB *pRVar2;
  int c;
  int c_00;
  Tuple2<pbrt::Point2,_int> p;
  Float FVar3;
  float fVar4;
  float fVar7;
  undefined1 auVar5 [16];
  undefined1 auVar8 [56];
  undefined1 auVar10 [56];
  SampledSpectrum SVar11;
  RGB local_80;
  SampledWavelengths *local_70;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  RGBSpectrum local_58;
  undefined1 auVar6 [64];
  undefined1 auVar9 [64];
  
  c_00 = 0;
  local_80.r = 0.0;
  local_80.g = 0.0;
  local_80.b = 0.0;
  p = (Tuple2<pbrt::Point2,_int>)st;
  local_70 = lambda;
  do {
    TVar1 = st->super_Tuple2<pbrt::Point2,_float>;
    auVar5._8_8_ = 0;
    auVar5._0_4_ = TVar1.x;
    auVar5._4_4_ = TVar1.y;
    auVar10 = (undefined1  [56])0x0;
    auVar5 = vmovshdup_avx(auVar5);
    p = (Tuple2<pbrt::Point2,_int>)
        (CONCAT44(p.y,(int)(TVar1.x *
                           (float)(this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x)) |
        (ulong)(uint)(int)(auVar5._0_4_ *
                          (float)(this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y) << 0x20
        );
    FVar3 = Image::GetChannel(&this->image,(Point2i)p,c_00,(WrapMode2D)0x200000002);
    pRVar2 = &local_80;
    if ((c_00 != 0) && (pRVar2 = (RGB *)&local_80.g, c_00 != 1)) {
      pRVar2 = (RGB *)&local_80.b;
    }
    c_00 = c_00 + 1;
    pRVar2->r = FVar3;
  } while (c_00 != 3);
  FVar3 = this->scale;
  local_68._4_4_ = FVar3;
  local_68._0_4_ = FVar3;
  fStack_60 = FVar3;
  fStack_5c = FVar3;
  auVar8 = ZEXT856(local_68._8_8_);
  RGBSpectrum::RGBSpectrum(&local_58,this->imageColorSpace,&local_80);
  SVar11 = RGBSpectrum::Sample(&local_58,local_70);
  auVar9._0_8_ = SVar11.values.values._8_8_;
  auVar9._8_56_ = auVar10;
  auVar6._0_8_ = SVar11.values.values._0_8_;
  auVar6._8_56_ = auVar8;
  auVar5 = vmovlhps_avx(auVar6._0_16_,auVar9._0_16_);
  fVar4 = auVar5._0_4_ * (float)local_68._0_4_;
  fVar7 = auVar5._4_4_ * (float)local_68._4_4_;
  auVar5 = CONCAT412(auVar5._12_4_ * fStack_5c,
                     CONCAT48(auVar5._8_4_ * fStack_60,CONCAT44(fVar7,fVar4)));
  auVar5 = vshufpd_avx(auVar5,auVar5,1);
  SVar11.values.values._8_8_ = auVar5._0_8_;
  SVar11.values.values[0] = fVar4;
  SVar11.values.values[1] = fVar7;
  return (SampledSpectrum)SVar11.values.values;
}

Assistant:

SampledSpectrum PortalImageInfiniteLight::ImageLookup(
    const Point2f &st, const SampledWavelengths &lambda) const {
    RGB rgb;
    for (int c = 0; c < 3; ++c)
        rgb[c] = image.LookupNearestChannel(st, c);
    return scale * RGBSpectrum(*imageColorSpace, rgb).Sample(lambda);
}